

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  ulong uVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  NodeRef *pNVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  undefined8 extraout_XMM1_Qa;
  float fVar42;
  undefined1 auVar32 [16];
  float fVar41;
  float fVar44;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar43;
  float fVar45;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 extraout_var [56];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar66;
  undefined1 auVar57 [16];
  float fVar67;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar64;
  float fVar65;
  undefined1 auVar63 [64];
  float fVar68;
  undefined1 auVar69 [16];
  float fVar78;
  undefined1 auVar70 [16];
  float fVar75;
  float fVar77;
  float fVar79;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar74;
  float fVar76;
  undefined1 auVar73 [64];
  float fVar80;
  float fVar87;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar85;
  float fVar86;
  undefined1 auVar84 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  float fVar91;
  float fVar100;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar98;
  float fVar99;
  undefined1 auVar97 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  float fVar104;
  float fVar105;
  undefined1 auVar106 [16];
  float fVar117;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar114;
  float fVar116;
  float fVar118;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar113;
  float fVar115;
  undefined1 auVar112 [64];
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar120 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [64];
  float fVar133;
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar135 [64];
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar143 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  long local_15d0;
  undefined1 local_1568 [16];
  undefined1 (*local_1550) [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  RTCHitN local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  uint local_1358;
  uint uStack_1354;
  uint uStack_1350;
  uint uStack_134c;
  uint uStack_1348;
  uint uStack_1344;
  uint uStack_1340;
  uint uStack_133c;
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  pNVar21 = stack + 1;
  stack[0] = root;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar84 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar90 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar97 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  fVar30 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar41 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar42 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar26 = ZEXT416((uint)(fVar30 * 0.99999964));
  auVar26 = vshufps_avx(auVar26,auVar26,0);
  auVar103 = ZEXT3264(CONCAT1616(auVar26,auVar26));
  auVar26 = ZEXT416((uint)(fVar41 * 0.99999964));
  auVar26 = vshufps_avx(auVar26,auVar26,0);
  auVar73 = ZEXT3264(CONCAT1616(auVar26,auVar26));
  auVar26 = ZEXT416((uint)(fVar42 * 0.99999964));
  auVar26 = vshufps_avx(auVar26,auVar26,0);
  auVar112 = ZEXT3264(CONCAT1616(auVar26,auVar26));
  auVar26 = ZEXT416((uint)(fVar30 * 1.0000004));
  auVar26 = vshufps_avx(auVar26,auVar26,0);
  auVar120 = ZEXT3264(CONCAT1616(auVar26,auVar26));
  auVar26 = ZEXT416((uint)(fVar41 * 1.0000004));
  auVar26 = vshufps_avx(auVar26,auVar26,0);
  auVar127 = ZEXT3264(CONCAT1616(auVar26,auVar26));
  auVar26 = ZEXT416((uint)(fVar42 * 1.0000004));
  auVar26 = vshufps_avx(auVar26,auVar26,0);
  auVar63 = ZEXT3264(CONCAT1616(auVar26,auVar26));
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar2 = (tray->tnear).field_0.i[k];
  auVar129 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(
                                                  iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  iVar2 = (tray->tfar).field_0.i[k];
  auVar135 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(
                                                  iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_1550 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar25 = true;
  do {
    uVar20 = pNVar21[-1].ptr;
    pNVar21 = pNVar21 + -1;
    local_11f8 = auVar84._0_32_;
    local_1218 = auVar90._0_32_;
    local_1238 = auVar97._0_32_;
    while ((uVar20 & 8) == 0) {
      auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar22),local_11f8);
      auVar10._4_4_ = auVar103._4_4_ * auVar9._4_4_;
      auVar10._0_4_ = auVar103._0_4_ * auVar9._0_4_;
      auVar10._8_4_ = auVar103._8_4_ * auVar9._8_4_;
      auVar10._12_4_ = auVar103._12_4_ * auVar9._12_4_;
      auVar10._16_4_ = auVar103._16_4_ * auVar9._16_4_;
      auVar10._20_4_ = auVar103._20_4_ * auVar9._20_4_;
      auVar10._24_4_ = auVar103._24_4_ * auVar9._24_4_;
      auVar10._28_4_ = auVar9._28_4_;
      auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar23),local_1218);
      auVar11._4_4_ = auVar73._4_4_ * auVar9._4_4_;
      auVar11._0_4_ = auVar73._0_4_ * auVar9._0_4_;
      auVar11._8_4_ = auVar73._8_4_ * auVar9._8_4_;
      auVar11._12_4_ = auVar73._12_4_ * auVar9._12_4_;
      auVar11._16_4_ = auVar73._16_4_ * auVar9._16_4_;
      auVar11._20_4_ = auVar73._20_4_ * auVar9._20_4_;
      auVar11._24_4_ = auVar73._24_4_ * auVar9._24_4_;
      auVar11._28_4_ = auVar9._28_4_;
      auVar9 = vmaxps_avx(auVar10,auVar11);
      auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar24),local_1238);
      auVar12._4_4_ = auVar112._4_4_ * auVar10._4_4_;
      auVar12._0_4_ = auVar112._0_4_ * auVar10._0_4_;
      auVar12._8_4_ = auVar112._8_4_ * auVar10._8_4_;
      auVar12._12_4_ = auVar112._12_4_ * auVar10._12_4_;
      auVar12._16_4_ = auVar112._16_4_ * auVar10._16_4_;
      auVar12._20_4_ = auVar112._20_4_ * auVar10._20_4_;
      auVar12._24_4_ = auVar112._24_4_ * auVar10._24_4_;
      auVar12._28_4_ = auVar10._28_4_;
      auVar10 = vmaxps_avx(auVar12,auVar129._0_32_);
      auVar9 = vmaxps_avx(auVar9,auVar10);
      auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + (uVar22 ^ 0x20)),local_11f8);
      auVar13._4_4_ = auVar120._4_4_ * auVar10._4_4_;
      auVar13._0_4_ = auVar120._0_4_ * auVar10._0_4_;
      auVar13._8_4_ = auVar120._8_4_ * auVar10._8_4_;
      auVar13._12_4_ = auVar120._12_4_ * auVar10._12_4_;
      auVar13._16_4_ = auVar120._16_4_ * auVar10._16_4_;
      auVar13._20_4_ = auVar120._20_4_ * auVar10._20_4_;
      auVar13._24_4_ = auVar120._24_4_ * auVar10._24_4_;
      auVar13._28_4_ = auVar10._28_4_;
      auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + (uVar23 ^ 0x20)),local_1218);
      auVar14._4_4_ = auVar127._4_4_ * auVar10._4_4_;
      auVar14._0_4_ = auVar127._0_4_ * auVar10._0_4_;
      auVar14._8_4_ = auVar127._8_4_ * auVar10._8_4_;
      auVar14._12_4_ = auVar127._12_4_ * auVar10._12_4_;
      auVar14._16_4_ = auVar127._16_4_ * auVar10._16_4_;
      auVar14._20_4_ = auVar127._20_4_ * auVar10._20_4_;
      auVar14._24_4_ = auVar127._24_4_ * auVar10._24_4_;
      auVar14._28_4_ = auVar10._28_4_;
      auVar10 = vminps_avx(auVar13,auVar14);
      auVar11 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + (uVar24 ^ 0x20)),local_1238);
      auVar15._4_4_ = auVar63._4_4_ * auVar11._4_4_;
      auVar15._0_4_ = auVar63._0_4_ * auVar11._0_4_;
      auVar15._8_4_ = auVar63._8_4_ * auVar11._8_4_;
      auVar15._12_4_ = auVar63._12_4_ * auVar11._12_4_;
      auVar15._16_4_ = auVar63._16_4_ * auVar11._16_4_;
      auVar15._20_4_ = auVar63._20_4_ * auVar11._20_4_;
      auVar15._24_4_ = auVar63._24_4_ * auVar11._24_4_;
      auVar15._28_4_ = auVar11._28_4_;
      auVar11 = vminps_avx(auVar15,auVar135._0_32_);
      auVar10 = vminps_avx(auVar10,auVar11);
      auVar9 = vcmpps_avx(auVar9,auVar10,2);
      uVar18 = vmovmskps_avx(auVar9);
      if (uVar18 == 0) goto LAB_003f230e;
      uVar18 = uVar18 & 0xff;
      uVar16 = uVar20 & 0xfffffffffffffff0;
      lVar19 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
        }
      }
      uVar20 = *(ulong *)(uVar16 + lVar19 * 8);
      uVar18 = uVar18 - 1 & uVar18;
      if (uVar18 != 0) {
        pNVar21->ptr = uVar20;
        pNVar21 = pNVar21 + 1;
        lVar19 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
          }
        }
        uVar20 = *(ulong *)(uVar16 + lVar19 * 8);
        uVar18 = uVar18 - 1 & uVar18;
        uVar17 = (ulong)uVar18;
        if (uVar18 != 0) {
          do {
            pNVar21->ptr = uVar20;
            pNVar21 = pNVar21 + 1;
            lVar19 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            uVar20 = *(ulong *)(uVar16 + lVar19 * 8);
            uVar17 = uVar17 & uVar17 - 1;
          } while (uVar17 != 0);
        }
      }
    }
    uVar16 = (ulong)((uint)uVar20 & 0xf);
    if (uVar16 != 8) {
      uVar20 = uVar20 & 0xfffffffffffffff0;
      local_15d0 = 0;
      local_1258 = auVar103._0_32_;
      local_1278 = auVar73._0_32_;
      local_1298 = auVar112._0_32_;
      local_12b8 = auVar120._0_32_;
      local_12d8 = auVar127._0_32_;
      local_12f8 = auVar63._0_32_;
      local_1318 = auVar129._0_32_;
      local_1338 = auVar135._0_32_;
      do {
        lVar19 = local_15d0 * 0xb0;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar32._4_4_ = uVar1;
        auVar32._0_4_ = uVar1;
        auVar32._8_4_ = uVar1;
        auVar32._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar46._4_4_ = uVar1;
        auVar46._0_4_ = uVar1;
        auVar46._8_4_ = uVar1;
        auVar46._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar69._4_4_ = uVar1;
        auVar69._0_4_ = uVar1;
        auVar69._8_4_ = uVar1;
        auVar69._12_4_ = uVar1;
        auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar20 + lVar19),auVar32);
        auVar29 = vsubps_avx(*(undefined1 (*) [16])(uVar20 + 0x10 + lVar19),auVar46);
        auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar20 + 0x20 + lVar19),auVar69);
        auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar20 + 0x30 + lVar19),auVar32);
        auVar48 = vsubps_avx(*(undefined1 (*) [16])(uVar20 + 0x40 + lVar19),auVar46);
        auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar20 + 0x50 + lVar19),auVar69);
        auVar32 = vsubps_avx(*(undefined1 (*) [16])(uVar20 + 0x60 + lVar19),auVar32);
        auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar20 + 0x70 + lVar19),auVar46);
        auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar20 + 0x80 + lVar19),auVar69);
        auVar57 = vsubps_avx(auVar32,auVar26);
        auVar71 = vsubps_avx(auVar46,auVar29);
        auVar33 = vsubps_avx(auVar69,auVar34);
        fVar56 = auVar29._0_4_;
        fVar30 = fVar56 + auVar46._0_4_;
        fVar64 = auVar29._4_4_;
        fVar41 = fVar64 + auVar46._4_4_;
        fVar65 = auVar29._8_4_;
        fVar42 = fVar65 + auVar46._8_4_;
        fVar66 = auVar29._12_4_;
        fVar44 = fVar66 + auVar46._12_4_;
        fVar142 = auVar34._0_4_;
        fVar68 = fVar142 + auVar69._0_4_;
        fVar144 = auVar34._4_4_;
        fVar74 = fVar144 + auVar69._4_4_;
        fVar145 = auVar34._8_4_;
        fVar76 = fVar145 + auVar69._8_4_;
        fVar146 = auVar34._12_4_;
        fVar78 = fVar146 + auVar69._12_4_;
        fVar31 = auVar33._0_4_;
        auVar106._0_4_ = fVar30 * fVar31;
        fVar43 = auVar33._4_4_;
        auVar106._4_4_ = fVar41 * fVar43;
        fVar45 = auVar33._8_4_;
        auVar106._8_4_ = fVar42 * fVar45;
        fVar8 = auVar33._12_4_;
        auVar106._12_4_ = fVar44 * fVar8;
        fVar147 = auVar71._0_4_;
        auVar124._0_4_ = fVar147 * fVar68;
        fVar148 = auVar71._4_4_;
        auVar124._4_4_ = fVar148 * fVar74;
        fVar149 = auVar71._8_4_;
        auVar124._8_4_ = fVar149 * fVar76;
        fVar150 = auVar71._12_4_;
        auVar124._12_4_ = fVar150 * fVar78;
        auVar71 = vsubps_avx(auVar124,auVar106);
        fVar91 = auVar26._0_4_;
        fVar104 = fVar91 + auVar32._0_4_;
        fVar98 = auVar26._4_4_;
        fVar113 = fVar98 + auVar32._4_4_;
        fVar99 = auVar26._8_4_;
        fVar115 = fVar99 + auVar32._8_4_;
        fVar100 = auVar26._12_4_;
        fVar117 = fVar100 + auVar32._12_4_;
        fVar128 = auVar57._0_4_;
        auVar70._0_4_ = fVar128 * fVar68;
        fVar130 = auVar57._4_4_;
        auVar70._4_4_ = fVar130 * fVar74;
        fVar131 = auVar57._8_4_;
        auVar70._8_4_ = fVar131 * fVar76;
        fVar132 = auVar57._12_4_;
        auVar70._12_4_ = fVar132 * fVar78;
        auVar125._0_4_ = fVar104 * fVar31;
        auVar125._4_4_ = fVar113 * fVar43;
        auVar125._8_4_ = fVar115 * fVar45;
        auVar125._12_4_ = fVar117 * fVar8;
        auVar57 = vsubps_avx(auVar125,auVar70);
        auVar107._0_4_ = fVar104 * fVar147;
        auVar107._4_4_ = fVar113 * fVar148;
        auVar107._8_4_ = fVar115 * fVar149;
        auVar107._12_4_ = fVar117 * fVar150;
        auVar33._0_4_ = fVar128 * fVar30;
        auVar33._4_4_ = fVar130 * fVar41;
        auVar33._8_4_ = fVar131 * fVar42;
        auVar33._12_4_ = fVar132 * fVar44;
        auVar33 = vsubps_avx(auVar33,auVar107);
        fVar30 = *(float *)(ray + k * 4 + 0x60);
        fVar41 = *(float *)(ray + k * 4 + 0x50);
        fVar42 = *(float *)(ray + k * 4 + 0x40);
        auVar126._0_4_ = fVar42 * auVar71._0_4_ + fVar30 * auVar33._0_4_ + fVar41 * auVar57._0_4_;
        auVar126._4_4_ = fVar42 * auVar71._4_4_ + fVar30 * auVar33._4_4_ + fVar41 * auVar57._4_4_;
        auVar126._8_4_ = fVar42 * auVar71._8_4_ + fVar30 * auVar33._8_4_ + fVar41 * auVar57._8_4_;
        auVar126._12_4_ =
             fVar42 * auVar71._12_4_ + fVar30 * auVar33._12_4_ + fVar41 * auVar57._12_4_;
        auVar29 = vsubps_avx(auVar29,auVar48);
        auVar34 = vsubps_avx(auVar34,auVar58);
        fVar78 = auVar48._0_4_ + fVar56;
        fVar104 = auVar48._4_4_ + fVar64;
        fVar113 = auVar48._8_4_ + fVar65;
        fVar115 = auVar48._12_4_ + fVar66;
        fVar117 = fVar142 + auVar58._0_4_;
        fVar75 = fVar144 + auVar58._4_4_;
        fVar77 = fVar145 + auVar58._8_4_;
        fVar79 = fVar146 + auVar58._12_4_;
        fVar44 = auVar34._0_4_;
        auVar143._0_4_ = fVar78 * fVar44;
        fVar68 = auVar34._4_4_;
        auVar143._4_4_ = fVar104 * fVar68;
        fVar74 = auVar34._8_4_;
        auVar143._8_4_ = fVar113 * fVar74;
        fVar76 = auVar34._12_4_;
        auVar143._12_4_ = fVar115 * fVar76;
        fVar133 = auVar29._0_4_;
        auVar57._0_4_ = fVar133 * fVar117;
        fVar136 = auVar29._4_4_;
        auVar57._4_4_ = fVar136 * fVar75;
        fVar138 = auVar29._8_4_;
        auVar57._8_4_ = fVar138 * fVar77;
        fVar140 = auVar29._12_4_;
        auVar57._12_4_ = fVar140 * fVar79;
        auVar29 = vsubps_avx(auVar57,auVar143);
        auVar26 = vsubps_avx(auVar26,auVar47);
        fVar119 = auVar26._0_4_;
        auVar71._0_4_ = fVar119 * fVar117;
        fVar121 = auVar26._4_4_;
        auVar71._4_4_ = fVar121 * fVar75;
        fVar122 = auVar26._8_4_;
        auVar71._8_4_ = fVar122 * fVar77;
        fVar123 = auVar26._12_4_;
        auVar71._12_4_ = fVar123 * fVar79;
        fVar117 = auVar47._0_4_ + fVar91;
        fVar75 = auVar47._4_4_ + fVar98;
        fVar77 = auVar47._8_4_ + fVar99;
        fVar79 = auVar47._12_4_ + fVar100;
        auVar108._0_4_ = fVar117 * fVar44;
        auVar108._4_4_ = fVar75 * fVar68;
        auVar108._8_4_ = fVar77 * fVar74;
        auVar108._12_4_ = fVar79 * fVar76;
        auVar26 = vsubps_avx(auVar108,auVar71);
        auVar92._0_4_ = fVar133 * fVar117;
        auVar92._4_4_ = fVar136 * fVar75;
        auVar92._8_4_ = fVar138 * fVar77;
        auVar92._12_4_ = fVar140 * fVar79;
        auVar34._0_4_ = fVar119 * fVar78;
        auVar34._4_4_ = fVar121 * fVar104;
        auVar34._8_4_ = fVar122 * fVar113;
        auVar34._12_4_ = fVar123 * fVar115;
        auVar34 = vsubps_avx(auVar34,auVar92);
        auVar72._0_4_ = fVar42 * auVar29._0_4_ + fVar30 * auVar34._0_4_ + fVar41 * auVar26._0_4_;
        auVar72._4_4_ = fVar42 * auVar29._4_4_ + fVar30 * auVar34._4_4_ + fVar41 * auVar26._4_4_;
        auVar72._8_4_ = fVar42 * auVar29._8_4_ + fVar30 * auVar34._8_4_ + fVar41 * auVar26._8_4_;
        auVar72._12_4_ = fVar42 * auVar29._12_4_ + fVar30 * auVar34._12_4_ + fVar41 * auVar26._12_4_
        ;
        auVar26 = vsubps_avx(auVar47,auVar32);
        fVar75 = auVar47._0_4_ + auVar32._0_4_;
        fVar77 = auVar47._4_4_ + auVar32._4_4_;
        fVar79 = auVar47._8_4_ + auVar32._8_4_;
        fVar67 = auVar47._12_4_ + auVar32._12_4_;
        auVar29 = vsubps_avx(auVar48,auVar46);
        fVar80 = auVar48._0_4_ + auVar46._0_4_;
        fVar85 = auVar48._4_4_ + auVar46._4_4_;
        fVar86 = auVar48._8_4_ + auVar46._8_4_;
        fVar87 = auVar48._12_4_ + auVar46._12_4_;
        auVar34 = vsubps_avx(auVar58,auVar69);
        fVar104 = auVar58._0_4_ + auVar69._0_4_;
        fVar113 = auVar58._4_4_ + auVar69._4_4_;
        fVar115 = auVar58._8_4_ + auVar69._8_4_;
        fVar117 = auVar58._12_4_ + auVar69._12_4_;
        fVar134 = auVar34._0_4_;
        auVar93._0_4_ = fVar134 * fVar80;
        fVar137 = auVar34._4_4_;
        auVar93._4_4_ = fVar137 * fVar85;
        fVar139 = auVar34._8_4_;
        auVar93._8_4_ = fVar139 * fVar86;
        fVar141 = auVar34._12_4_;
        auVar93._12_4_ = fVar141 * fVar87;
        fVar105 = auVar29._0_4_;
        auVar101._0_4_ = fVar105 * fVar104;
        fVar114 = auVar29._4_4_;
        auVar101._4_4_ = fVar114 * fVar113;
        fVar116 = auVar29._8_4_;
        auVar101._8_4_ = fVar116 * fVar115;
        fVar118 = auVar29._12_4_;
        auVar101._12_4_ = fVar118 * fVar117;
        auVar29 = vsubps_avx(auVar101,auVar93);
        fVar78 = auVar26._0_4_;
        auVar47._0_4_ = fVar78 * fVar104;
        fVar104 = auVar26._4_4_;
        auVar47._4_4_ = fVar104 * fVar113;
        fVar113 = auVar26._8_4_;
        auVar47._8_4_ = fVar113 * fVar115;
        fVar115 = auVar26._12_4_;
        auVar47._12_4_ = fVar115 * fVar117;
        auVar26._0_4_ = fVar134 * fVar75;
        auVar26._4_4_ = fVar137 * fVar77;
        auVar26._8_4_ = fVar139 * fVar79;
        auVar26._12_4_ = fVar141 * fVar67;
        auVar26 = vsubps_avx(auVar26,auVar47);
        auVar58._0_4_ = fVar105 * fVar75;
        auVar58._4_4_ = fVar114 * fVar77;
        auVar58._8_4_ = fVar116 * fVar79;
        auVar58._12_4_ = fVar118 * fVar67;
        auVar81._0_4_ = fVar78 * fVar80;
        auVar81._4_4_ = fVar104 * fVar85;
        auVar81._8_4_ = fVar113 * fVar86;
        auVar81._12_4_ = fVar115 * fVar87;
        auVar34 = vsubps_avx(auVar81,auVar58);
        auVar48._0_4_ = fVar42 * auVar29._0_4_ + fVar30 * auVar34._0_4_ + fVar41 * auVar26._0_4_;
        auVar48._4_4_ = fVar42 * auVar29._4_4_ + fVar30 * auVar34._4_4_ + fVar41 * auVar26._4_4_;
        auVar48._8_4_ = fVar42 * auVar29._8_4_ + fVar30 * auVar34._8_4_ + fVar41 * auVar26._8_4_;
        auVar48._12_4_ = fVar42 * auVar29._12_4_ + fVar30 * auVar34._12_4_ + fVar41 * auVar26._12_4_
        ;
        auVar102._0_4_ = auVar48._0_4_ + auVar126._0_4_ + auVar72._0_4_;
        auVar102._4_4_ = auVar48._4_4_ + auVar126._4_4_ + auVar72._4_4_;
        auVar102._8_4_ = auVar48._8_4_ + auVar126._8_4_ + auVar72._8_4_;
        auVar102._12_4_ = auVar48._12_4_ + auVar126._12_4_ + auVar72._12_4_;
        auVar26 = vminps_avx(auVar126,auVar72);
        auVar29 = vminps_avx(auVar26,auVar48);
        auVar109._8_4_ = 0x7fffffff;
        auVar109._0_8_ = 0x7fffffff7fffffff;
        auVar109._12_4_ = 0x7fffffff;
        auVar26 = vandps_avx(auVar102,auVar109);
        auVar82._0_4_ = auVar26._0_4_ * 1.1920929e-07;
        auVar82._4_4_ = auVar26._4_4_ * 1.1920929e-07;
        auVar82._8_4_ = auVar26._8_4_ * 1.1920929e-07;
        auVar82._12_4_ = auVar26._12_4_ * 1.1920929e-07;
        uVar17 = CONCAT44(auVar82._4_4_,auVar82._0_4_);
        auVar94._0_8_ = uVar17 ^ 0x8000000080000000;
        auVar94._8_4_ = -auVar82._8_4_;
        auVar94._12_4_ = -auVar82._12_4_;
        auVar29 = vcmpps_avx(auVar29,auVar94,5);
        auVar34 = vmaxps_avx(auVar126,auVar72);
        auVar34 = vmaxps_avx(auVar34,auVar48);
        auVar34 = vcmpps_avx(auVar34,auVar82,2);
        auVar29 = vorps_avx(auVar29,auVar34);
        if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar29[0xf] < '\0') {
          auVar49._0_4_ = fVar31 * fVar133;
          auVar49._4_4_ = fVar43 * fVar136;
          auVar49._8_4_ = fVar45 * fVar138;
          auVar49._12_4_ = fVar8 * fVar140;
          auVar59._0_4_ = fVar44 * fVar147;
          auVar59._4_4_ = fVar68 * fVar148;
          auVar59._8_4_ = fVar74 * fVar149;
          auVar59._12_4_ = fVar76 * fVar150;
          auVar48 = vsubps_avx(auVar59,auVar49);
          auVar83._0_4_ = fVar44 * fVar105;
          auVar83._4_4_ = fVar68 * fVar114;
          auVar83._8_4_ = fVar74 * fVar116;
          auVar83._12_4_ = fVar76 * fVar118;
          auVar95._0_4_ = fVar134 * fVar133;
          auVar95._4_4_ = fVar137 * fVar136;
          auVar95._8_4_ = fVar139 * fVar138;
          auVar95._12_4_ = fVar141 * fVar140;
          auVar58 = vsubps_avx(auVar95,auVar83);
          auVar34 = vandps_avx(auVar109,auVar49);
          auVar47 = vandps_avx(auVar109,auVar83);
          auVar34 = vcmpps_avx(auVar34,auVar47,1);
          local_13f8 = vblendvps_avx(auVar58,auVar48,auVar34);
          auVar50._0_4_ = fVar119 * fVar134;
          auVar50._4_4_ = fVar121 * fVar137;
          auVar50._8_4_ = fVar122 * fVar139;
          auVar50._12_4_ = fVar123 * fVar141;
          auVar60._0_4_ = fVar119 * fVar31;
          auVar60._4_4_ = fVar121 * fVar43;
          auVar60._8_4_ = fVar122 * fVar45;
          auVar60._12_4_ = fVar123 * fVar8;
          auVar88._0_4_ = fVar44 * fVar128;
          auVar88._4_4_ = fVar68 * fVar130;
          auVar88._8_4_ = fVar74 * fVar131;
          auVar88._12_4_ = fVar76 * fVar132;
          auVar48 = vsubps_avx(auVar60,auVar88);
          auVar96._0_4_ = fVar44 * fVar78;
          auVar96._4_4_ = fVar68 * fVar104;
          auVar96._8_4_ = fVar74 * fVar113;
          auVar96._12_4_ = fVar76 * fVar115;
          auVar58 = vsubps_avx(auVar96,auVar50);
          auVar34 = vandps_avx(auVar109,auVar88);
          auVar47 = vandps_avx(auVar109,auVar50);
          auVar34 = vcmpps_avx(auVar34,auVar47,1);
          local_13e8 = vblendvps_avx(auVar58,auVar48,auVar34);
          auVar35._0_4_ = fVar133 * fVar78;
          auVar35._4_4_ = fVar136 * fVar104;
          auVar35._8_4_ = fVar138 * fVar113;
          auVar35._12_4_ = fVar140 * fVar115;
          auVar51._0_4_ = fVar128 * fVar133;
          auVar51._4_4_ = fVar130 * fVar136;
          auVar51._8_4_ = fVar131 * fVar138;
          auVar51._12_4_ = fVar132 * fVar140;
          auVar61._0_4_ = fVar119 * fVar147;
          auVar61._4_4_ = fVar121 * fVar148;
          auVar61._8_4_ = fVar122 * fVar149;
          auVar61._12_4_ = fVar123 * fVar150;
          auVar27._0_4_ = fVar119 * fVar105;
          auVar27._4_4_ = fVar121 * fVar114;
          auVar27._8_4_ = fVar122 * fVar116;
          auVar27._12_4_ = fVar123 * fVar118;
          auVar48 = vsubps_avx(auVar51,auVar61);
          auVar58 = vsubps_avx(auVar27,auVar35);
          auVar34 = vandps_avx(auVar109,auVar61);
          auVar47 = vandps_avx(auVar109,auVar35);
          auVar34 = vcmpps_avx(auVar34,auVar47,1);
          local_13d8 = vblendvps_avx(auVar58,auVar48,auVar34);
          fVar31 = local_13f8._0_4_ * fVar42 + local_13d8._0_4_ * fVar30 + local_13e8._0_4_ * fVar41
          ;
          fVar44 = local_13f8._4_4_ * fVar42 + local_13d8._4_4_ * fVar30 + local_13e8._4_4_ * fVar41
          ;
          fVar43 = local_13f8._8_4_ * fVar42 + local_13d8._8_4_ * fVar30 + local_13e8._8_4_ * fVar41
          ;
          fVar30 = local_13f8._12_4_ * fVar42 +
                   local_13d8._12_4_ * fVar30 + local_13e8._12_4_ * fVar41;
          auVar52._0_4_ = fVar31 + fVar31;
          auVar52._4_4_ = fVar44 + fVar44;
          auVar52._8_4_ = fVar43 + fVar43;
          auVar52._12_4_ = fVar30 + fVar30;
          fVar44 = local_13f8._0_4_ * fVar91 +
                   local_13d8._0_4_ * fVar142 + local_13e8._0_4_ * fVar56;
          fVar43 = local_13f8._4_4_ * fVar98 +
                   local_13d8._4_4_ * fVar144 + local_13e8._4_4_ * fVar64;
          fVar68 = local_13f8._8_4_ * fVar99 +
                   local_13d8._8_4_ * fVar145 + local_13e8._8_4_ * fVar65;
          fVar45 = local_13f8._12_4_ * fVar100 +
                   local_13d8._12_4_ * fVar146 + local_13e8._12_4_ * fVar66;
          auVar34 = vrcpps_avx(auVar52);
          fVar30 = auVar34._0_4_;
          auVar89._0_4_ = auVar52._0_4_ * fVar30;
          fVar41 = auVar34._4_4_;
          auVar89._4_4_ = auVar52._4_4_ * fVar41;
          fVar42 = auVar34._8_4_;
          auVar89._8_4_ = auVar52._8_4_ * fVar42;
          fVar31 = auVar34._12_4_;
          auVar89._12_4_ = auVar52._12_4_ * fVar31;
          auVar110._8_4_ = 0x3f800000;
          auVar110._0_8_ = 0x3f8000003f800000;
          auVar110._12_4_ = 0x3f800000;
          auVar34 = vsubps_avx(auVar110,auVar89);
          local_1408._0_4_ = (fVar44 + fVar44) * (fVar30 + fVar30 * auVar34._0_4_);
          local_1408._4_4_ = (fVar43 + fVar43) * (fVar41 + fVar41 * auVar34._4_4_);
          local_1408._8_4_ = (fVar68 + fVar68) * (fVar42 + fVar42 * auVar34._8_4_);
          local_1408._12_4_ = (fVar45 + fVar45) * (fVar31 + fVar31 * auVar34._12_4_);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar62._4_4_ = uVar1;
          auVar62._0_4_ = uVar1;
          auVar62._8_4_ = uVar1;
          auVar62._12_4_ = uVar1;
          auVar34 = vcmpps_avx(auVar62,local_1408,2);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar111._4_4_ = uVar1;
          auVar111._0_4_ = uVar1;
          auVar111._8_4_ = uVar1;
          auVar111._12_4_ = uVar1;
          auVar63 = ZEXT1664(auVar111);
          auVar47 = vcmpps_avx(local_1408,auVar111,2);
          auVar34 = vandps_avx(auVar47,auVar34);
          auVar47 = auVar29 & auVar34;
          if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar47[0xf] < '\0') {
            auVar29 = vandps_avx(auVar29,auVar34);
            auVar34 = vcmpps_avx(auVar52,_DAT_01f7aa10,4);
            auVar29 = vandps_avx(auVar29,auVar34);
            uVar18 = vmovmskps_avx(auVar29);
            if (uVar18 != 0) {
              pSVar4 = context->scene;
              auVar29 = vrcpps_avx(auVar102);
              fVar30 = auVar29._0_4_;
              auVar36._0_4_ = auVar102._0_4_ * fVar30;
              fVar41 = auVar29._4_4_;
              auVar36._4_4_ = auVar102._4_4_ * fVar41;
              fVar42 = auVar29._8_4_;
              auVar36._8_4_ = auVar102._8_4_ * fVar42;
              fVar31 = auVar29._12_4_;
              auVar36._12_4_ = auVar102._12_4_ * fVar31;
              auVar53._8_4_ = 0x3f800000;
              auVar53._0_8_ = 0x3f8000003f800000;
              auVar53._12_4_ = 0x3f800000;
              auVar29 = vsubps_avx(auVar53,auVar36);
              auVar28._0_4_ = fVar30 + fVar30 * auVar29._0_4_;
              auVar28._4_4_ = fVar41 + fVar41 * auVar29._4_4_;
              auVar28._8_4_ = fVar42 + fVar42 * auVar29._8_4_;
              auVar28._12_4_ = fVar31 + fVar31 * auVar29._12_4_;
              auVar37._8_4_ = 0x219392ef;
              auVar37._0_8_ = 0x219392ef219392ef;
              auVar37._12_4_ = 0x219392ef;
              auVar26 = vcmpps_avx(auVar26,auVar37,5);
              auVar26 = vandps_avx(auVar26,auVar28);
              auVar38._0_4_ = auVar126._0_4_ * auVar26._0_4_;
              auVar38._4_4_ = auVar126._4_4_ * auVar26._4_4_;
              auVar38._8_4_ = auVar126._8_4_ * auVar26._8_4_;
              auVar38._12_4_ = auVar126._12_4_ * auVar26._12_4_;
              local_1428 = vminps_avx(auVar38,auVar53);
              auVar29._0_4_ = auVar72._0_4_ * auVar26._0_4_;
              auVar29._4_4_ = auVar72._4_4_ * auVar26._4_4_;
              auVar29._8_4_ = auVar72._8_4_ * auVar26._8_4_;
              auVar29._12_4_ = auVar72._12_4_ * auVar26._12_4_;
              local_1418 = vminps_avx(auVar29,auVar53);
              uVar17 = (ulong)(uVar18 & 0xff);
              do {
                uVar7 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                uVar18 = *(uint *)(lVar19 + uVar20 + 0x90 + uVar7 * 4);
                pGVar5 = (pSVar4->geometries).items[uVar18].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_003f2324:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar25;
                  }
                  uVar1 = *(undefined4 *)(local_1428 + uVar7 * 4);
                  auVar39._4_4_ = uVar1;
                  auVar39._0_4_ = uVar1;
                  auVar39._8_4_ = uVar1;
                  auVar39._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_1418 + uVar7 * 4);
                  auVar54._4_4_ = uVar1;
                  auVar54._0_4_ = uVar1;
                  auVar54._8_4_ = uVar1;
                  auVar54._12_4_ = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar7 * 4);
                  args.context = context->user;
                  local_1368 = vpshufd_avx(ZEXT416(uVar18),0);
                  uVar1 = *(undefined4 *)(lVar19 + uVar20 + 0xa0 + uVar7 * 4);
                  local_1378._4_4_ = uVar1;
                  local_1378._0_4_ = uVar1;
                  local_1378._8_4_ = uVar1;
                  local_1378._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_13f8 + uVar7 * 4);
                  uVar3 = *(undefined4 *)(local_13e8 + uVar7 * 4);
                  local_13b8._4_4_ = uVar3;
                  local_13b8._0_4_ = uVar3;
                  local_13b8._8_4_ = uVar3;
                  local_13b8._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_13d8 + uVar7 * 4);
                  local_13a8._4_4_ = uVar3;
                  local_13a8._0_4_ = uVar3;
                  local_13a8._8_4_ = uVar3;
                  local_13a8._12_4_ = uVar3;
                  local_13c8[0] = (RTCHitN)(char)uVar1;
                  local_13c8[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[4] = (RTCHitN)(char)uVar1;
                  local_13c8[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[8] = (RTCHitN)(char)uVar1;
                  local_13c8[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[0xc] = (RTCHitN)(char)uVar1;
                  local_13c8[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1398 = auVar39;
                  local_1388 = auVar54;
                  vcmpps_avx(ZEXT1632(local_1368),ZEXT1632(local_1368),0xf);
                  uStack_1354 = (args.context)->instID[0];
                  local_1358 = uStack_1354;
                  uStack_1350 = uStack_1354;
                  uStack_134c = uStack_1354;
                  uStack_1348 = (args.context)->instPrimID[0];
                  uStack_1344 = uStack_1348;
                  uStack_1340 = uStack_1348;
                  uStack_133c = uStack_1348;
                  local_1568 = *local_1550;
                  args.valid = (int *)local_1568;
                  args.geometryUserPtr = pGVar5->userPtr;
                  args.hit = local_13c8;
                  args.N = 4;
                  auVar26 = auVar63._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar5->occlusionFilterN)(&args);
                    auVar63._8_56_ = extraout_var;
                    auVar63._0_8_ = extraout_XMM1_Qa;
                    auVar39 = auVar63._0_16_;
                    auVar63 = ZEXT1664(auVar26);
                  }
                  if (local_1568 == (undefined1  [16])0x0) {
                    auVar29 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar26 = vpcmpeqd_avx(auVar39,auVar39);
                    auVar29 = auVar29 ^ auVar26;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    auVar29 = vpcmpeqd_avx(auVar54,auVar54);
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&args);
                      auVar63 = ZEXT1664(auVar26);
                      auVar29 = vpcmpeqd_avx(auVar29,auVar29);
                    }
                    auVar26 = vpcmpeqd_avx(local_1568,_DAT_01f7aa10);
                    auVar29 = auVar26 ^ auVar29;
                    auVar55._8_4_ = 0xff800000;
                    auVar55._0_8_ = 0xff800000ff800000;
                    auVar55._12_4_ = 0xff800000;
                    auVar26 = vblendvps_avx(auVar55,*(undefined1 (*) [16])(args.ray + 0x80),auVar26)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar26;
                  }
                  auVar40._8_8_ = 0x100000001;
                  auVar40._0_8_ = 0x100000001;
                  if ((auVar40 & auVar29) != (undefined1  [16])0x0) goto LAB_003f2324;
                  *(int *)(ray + k * 4 + 0x80) = auVar63._0_4_;
                }
                uVar17 = uVar17 ^ 1L << (uVar7 & 0x3f);
              } while (uVar17 != 0);
            }
          }
        }
        local_15d0 = local_15d0 + 1;
        auVar84 = ZEXT3264(local_11f8);
        auVar90 = ZEXT3264(local_1218);
        auVar97 = ZEXT3264(local_1238);
        auVar103 = ZEXT3264(local_1258);
        auVar73 = ZEXT3264(local_1278);
        auVar112 = ZEXT3264(local_1298);
        auVar120 = ZEXT3264(local_12b8);
        auVar127 = ZEXT3264(local_12d8);
        auVar63 = ZEXT3264(local_12f8);
        auVar129 = ZEXT3264(local_1318);
        auVar135 = ZEXT3264(local_1338);
      } while (local_15d0 != uVar16 - 8);
    }
LAB_003f230e:
    bVar25 = pNVar21 != stack;
    if (!bVar25) {
      return bVar25;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }